

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

string * __thiscall
testing::internal::WideStringToUtf8_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,wchar_t *str,int num_chars)

{
  size_t sVar1;
  uint uVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  ulong uVar4;
  stringstream stream;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar2 = (uint)str;
  if (uVar2 == 0xffffffff) {
    sVar1 = wcslen((wchar_t *)this);
    uVar2 = (uint)sVar1;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (0 < (int)uVar2) {
    uVar4 = 0;
    uVar3 = extraout_RDX;
    do {
      if (*(uint *)(this + uVar4 * 4) == 0) break;
      CodePointToUtf8_abi_cxx11_
                (&local_1d8,(internal *)(ulong)*(uint *)(this + uVar4 * 4),(UInt32)uVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      uVar3 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        uVar3 = extraout_RDX_01;
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  StringStreamToString(__return_storage_ptr__,(stringstream *)local_1b8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string WideStringToUtf8(const wchar_t* str, int num_chars) {
  if (num_chars == -1)
    num_chars = static_cast<int>(wcslen(str));

  ::std::stringstream stream;
  for (int i = 0; i < num_chars; ++i) {
    UInt32 unicode_code_point;

    if (str[i] == L'\0') {
      break;
    } else if (i + 1 < num_chars && IsUtf16SurrogatePair(str[i], str[i + 1])) {
      unicode_code_point = CreateCodePointFromUtf16SurrogatePair(str[i],
                                                                 str[i + 1]);
      i++;
    } else {
      unicode_code_point = static_cast<UInt32>(str[i]);
    }

    stream << CodePointToUtf8(unicode_code_point);
  }
  return StringStreamToString(&stream);
}